

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eckey_impl.h
# Opt level: O3

int secp256k1_eckey_pubkey_serialize(secp256k1_ge *elem,uchar *pub,size_t *size,int compressed)

{
  secp256k1_fe *r;
  
  if (elem->infinity != 0) {
    return 0;
  }
  secp256k1_fe_impl_normalize_var(&elem->x);
  r = &elem->y;
  secp256k1_fe_impl_normalize_var(r);
  secp256k1_fe_impl_get_b32(pub + 1,&elem->x);
  if (compressed == 0) {
    *size = 0x41;
    *pub = '\x04';
    secp256k1_fe_impl_get_b32(pub + 0x21,r);
  }
  else {
    *size = 0x21;
    *pub = (byte)r->n[0] & 1 | 2;
  }
  return 1;
}

Assistant:

static int secp256k1_eckey_pubkey_serialize(secp256k1_ge *elem, unsigned char *pub, size_t *size, int compressed) {
    if (secp256k1_ge_is_infinity(elem)) {
        return 0;
    }
    secp256k1_fe_normalize_var(&elem->x);
    secp256k1_fe_normalize_var(&elem->y);
    secp256k1_fe_get_b32(&pub[1], &elem->x);
    if (compressed) {
        *size = 33;
        pub[0] = secp256k1_fe_is_odd(&elem->y) ? SECP256K1_TAG_PUBKEY_ODD : SECP256K1_TAG_PUBKEY_EVEN;
    } else {
        *size = 65;
        pub[0] = SECP256K1_TAG_PUBKEY_UNCOMPRESSED;
        secp256k1_fe_get_b32(&pub[33], &elem->y);
    }
    return 1;
}